

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosTagger.hpp
# Opt level: O1

string * __thiscall
cppjieba::PosTagger::LookupTag
          (string *__return_storage_ptr__,PosTagger *this,string *str,SegmentTagged *segment)

{
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  DictUnit *pDVar5;
  char *__s;
  RuneStrArray runes;
  RuneStrArray local_300;
  Logger local_1a8;
  
  memset(&local_300,0,0x140);
  local_300.size_ = 0;
  local_300.capacity_ = 0x10;
  local_300.ptr_ = local_300.buffer_;
  iVar4 = (*(segment->super_SegmentBase)._vptr_SegmentBase[4])(segment);
  if (CONCAT44(extraout_var,iVar4) != 0) {
    bVar3 = DecodeRunesInString((str->_M_dataplus)._M_p,str->_M_string_length,&local_300);
    if (bVar3) {
      pDVar5 = Trie::Find(*(Trie **)(CONCAT44(extraout_var,iVar4) + 0x68),local_300.ptr_,
                          (RuneStr *)&(local_300.ptr_)->rune + local_300.size_);
      if ((pDVar5 == (DictUnit *)0x0) || (sVar1 = (pDVar5->tag)._M_string_length, sVar1 == 0)) {
        __s = SpecialRule(this,&local_300);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_1a8);
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar2 = (pDVar5->tag)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
      }
    }
    else {
      limonp::Logger::Logger
                (&local_1a8,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/PosTagger.hpp"
                 ,0x26);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Decode failed.",0xe)
      ;
      limonp::Logger::~Logger(&local_1a8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"x","");
    }
    if ((RuneStrArray *)local_300.ptr_ != &local_300) {
      free(local_300.ptr_);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("dict != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/PosTagger.hpp"
                ,0x24,
                "string cppjieba::PosTagger::LookupTag(const string &, const SegmentTagged &) const"
               );
}

Assistant:

string LookupTag(const string &str, const SegmentTagged& segment) const {
    const DictUnit *tmp = NULL;
    RuneStrArray runes;
    const DictTrie * dict = segment.GetDictTrie();
    assert(dict != NULL);
      if (!DecodeRunesInString(str, runes)) {
        XLOG(ERROR) << "Decode failed.";
        return POS_X;
      }
      tmp = dict->Find(runes.begin(), runes.end());
      if (tmp == NULL || tmp->tag.empty()) {
        return SpecialRule(runes);
      } else {
        return tmp->tag;
      }
  }